

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sampleSetRowid(sqlite3 *db,Stat4Sample *p,int n,u8 *pData)

{
  u8 *__dest;
  
  if (p->nRowid != 0) {
    sqlite3DbFree(db,(p->u).aRowid);
  }
  __dest = (u8 *)sqlite3DbMallocRawNN(db,(long)n);
  (p->u).aRowid = __dest;
  if (__dest != (u8 *)0x0) {
    p->nRowid = n;
    memcpy(__dest,pData,(long)n);
    return;
  }
  p->nRowid = 0;
  return;
}

Assistant:

static void sampleSetRowid(sqlite3 *db, Stat4Sample *p, int n, const u8 *pData){
  assert( db!=0 );
  if( p->nRowid ) sqlite3DbFree(db, p->u.aRowid);
  p->u.aRowid = sqlite3DbMallocRawNN(db, n);
  if( p->u.aRowid ){
    p->nRowid = n;
    memcpy(p->u.aRowid, pData, n);
  }else{
    p->nRowid = 0;
  }
}